

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::ComputeTargetObjectDirectory
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *gt)

{
  int iVar1;
  string *a;
  undefined4 extraout_var;
  string dir;
  char local_6b [3];
  char *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  a = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(gt->LocalGenerator);
  local_6b[1] = 0x2f;
  (*(gt->LocalGenerator->super_cmOutputConverter)._vptr_cmOutputConverter[0x10])
            (&local_60,gt->LocalGenerator,gt);
  local_6b[0] = '/';
  iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x17])(this);
  local_68 = (char *)CONCAT44(extraout_var,iVar1);
  local_6b[2] = 0x2f;
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,char_const*,char>
            (&local_40,a,local_6b + 1,&local_60,local_6b,&local_68,local_6b + 2);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::_M_assign((string *)&gt->ObjectDirectory);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::ComputeTargetObjectDirectory(
  cmGeneratorTarget* gt) const
{
  // Compute full path to object file directory for this target.
  std::string dir = cmStrCat(gt->LocalGenerator->GetCurrentBinaryDirectory(),
                             '/', gt->LocalGenerator->GetTargetDirectory(gt),
                             '/', this->GetCMakeCFGIntDir(), '/');
  gt->ObjectDirectory = dir;
}